

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_ostream.hpp
# Opt level: O0

ostream * __thiscall
boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>::
operator()(lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]> *this,
          ostream *ostr)

{
  ostream *poVar1;
  undefined8 in_RSI;
  long in_RDI;
  
  poVar1 = (ostream *)
           (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))(*(long **)(in_RDI + 0x10),in_RSI);
  poVar1 = std::operator<<(poVar1,*(char **)(in_RDI + 0x18));
  return poVar1;
}

Assistant:

virtual std::ostream&   operator()( std::ostream& ostr ) const
    {
        return m_prev(ostr) << m_value;
    }